

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O2

iterator * __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
::end(iterator *__return_storage_ptr__,
     StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
     *this)

{
  int iVar1;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar2;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar3;
  
  iVar1 = this->bsize;
  ppuVar2 = this->dataptr;
  if ((long)iVar1 == 0x20) {
    if (ppuVar2 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar2 = &end::emptyValue;
    }
    else {
      ppuVar2 = ppuVar2 + (long)this->dataSlotIndex + 1;
    }
    puVar3 = *ppuVar2;
    iVar1 = 0;
  }
  else {
    ppuVar2 = ppuVar2 + this->dataSlotIndex;
    puVar3 = *ppuVar2 + iVar1;
  }
  __return_storage_ptr__->vec = ppuVar2;
  __return_storage_ptr__->ptr = puVar3;
  __return_storage_ptr__->offset = iVar1;
  return __return_storage_ptr__;
}

Assistant:

iterator end()
        {
            static X* emptyValue{nullptr};
            if (bsize == blockSize) {
                X** ptr = (dataptr != nullptr) ? &(dataptr[dataSlotIndex + 1]) :
                                                 &emptyValue;
                return {ptr, 0};
            }
            X** ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }